

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  byte bVar1;
  element_type *peVar2;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  size_t pos;
  string_t result;
  long local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  throw_if_invalid_utf8(s);
  sVar3 = extra_space(s,ensure_ascii);
  if (sVar3 == 0) {
    peVar2 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,(s->_M_dataplus)._M_p,s->_M_string_length);
    return;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)sVar3 + (char)s->_M_string_length);
  local_58 = 0;
  uVar4 = s->_M_string_length;
  if (uVar4 == 0) {
    local_58 = 0;
  }
  else {
    uVar7 = 0;
    do {
      bVar1 = (s->_M_dataplus)._M_p[uVar7];
      switch(bVar1) {
      case 8:
        local_50[local_58 + 1] = 0x62;
        break;
      case 9:
        local_50[local_58 + 1] = 0x74;
        break;
      case 10:
        local_50[local_58 + 1] = 0x6e;
        break;
      case 0xb:
switchD_0010f5dd_caseD_b:
        bVar5 = bVar1;
        if ((char)bVar1 < '\0') {
          if (ensure_ascii) {
            lVar6 = 1;
            if (((bVar1 & 0xe0) != 0xc0) && (lVar6 = 2, (bVar1 & 0xf0) != 0xe0)) {
              bVar5 = bVar1 & 0xf8;
              lVar6 = 3;
              if (bVar5 != 0xf0) {
                __assert_fail("bytes != std::string::npos",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                              ,0x19a1,
                              "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                             );
              }
            }
            goto LAB_0010f6db;
          }
        }
        else if (bVar1 == 0x7f && ensure_ascii || bVar1 < 0x20) {
          lVar6 = 0;
LAB_0010f6db:
          if (uVar4 <= lVar6 + uVar7) {
            __assert_fail("i + bytes < s.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                          ,0x19a4,
                          "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                         );
          }
          (*(code *)((long)&DAT_00114cfc + (long)(int)(&DAT_00114cfc)[lVar6]))
                    (bVar1,bVar5,(code *)((long)&DAT_00114cfc + (long)(int)(&DAT_00114cfc)[lVar6]));
          return;
        }
        local_50[local_58] = bVar1;
        local_58 = local_58 + 1;
        goto LAB_0010f681;
      case 0xc:
        local_50[local_58 + 1] = 0x66;
        break;
      case 0xd:
        local_50[local_58 + 1] = 0x72;
        break;
      default:
        if (bVar1 != 0x5c) {
          if (bVar1 != 0x22) goto switchD_0010f5dd_caseD_b;
          local_50[local_58 + 1] = 0x22;
        }
      }
      local_58 = local_58 + 2;
LAB_0010f681:
      uVar7 = uVar7 + 1;
      uVar4 = s->_M_string_length;
    } while (uVar7 < uVar4);
  }
  if (local_58 != local_48) {
    __assert_fail("pos == result.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                  ,0x19dd,
                  "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  peVar2 = (this->o).
           super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii) const
    {
        throw_if_invalid_utf8(s);

        const auto space = extra_space(s, ensure_ascii);
        if (space == 0)
        {
            o->write_characters(s.c_str(), s.size());
            return;
        }

        // create a result string of necessary size
        string_t result(s.size() + space, '\\');
        std::size_t pos = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            switch (s[i])
            {
                case '"': // quotation mark (0x22)
                {
                    result[pos + 1] = '"';
                    pos += 2;
                    break;
                }

                case '\\': // reverse solidus (0x5C)
                {
                    // nothing to change
                    pos += 2;
                    break;
                }

                case '\b': // backspace (0x08)
                {
                    result[pos + 1] = 'b';
                    pos += 2;
                    break;
                }

                case '\f': // formfeed (0x0C)
                {
                    result[pos + 1] = 'f';
                    pos += 2;
                    break;
                }

                case '\n': // newline (0x0A)
                {
                    result[pos + 1] = 'n';
                    pos += 2;
                    break;
                }

                case '\r': // carriage return (0x0D)
                {
                    result[pos + 1] = 'r';
                    pos += 2;
                    break;
                }

                case '\t': // horizontal tab (0x09)
                {
                    result[pos + 1] = 't';
                    pos += 2;
                    break;
                }

                default:
                {
                    // escape control characters (0x00..0x1F) or, if
                    // ensure_ascii parameter is used, non-ASCII characters
                    if ((0x00 <= s[i] and s[i] <= 0x1F) or
                            (ensure_ascii and (s[i] & 0x80 or s[i] == 0x7F)))
                    {
                        const auto bytes = bytes_following(static_cast<uint8_t>(s[i]));
                        // invalid characters will be detected by throw_if_invalid_utf8
                        assert (bytes != std::string::npos);

                        // check that the additional bytes are present
                        assert(i + bytes < s.size());

                        // to use \uxxxx escaping, we first need to calculate
                        // the codepoint from the UTF-8 bytes
                        int codepoint = 0;

                        // bytes is unsigned type:
                        assert(bytes <= 3);
                        switch (bytes)
                        {
                            case 0:
                            {
                                codepoint = s[i] & 0xFF;
                                break;
                            }

                            case 1:
                            {
                                codepoint = ((s[i] & 0x3F) << 6)
                                            + (s[i + 1] & 0x7F);
                                break;
                            }

                            case 2:
                            {
                                codepoint = ((s[i] & 0x1F) << 12)
                                            + ((s[i + 1] & 0x7F) << 6)
                                            + (s[i + 2] & 0x7F);
                                break;
                            }

                            case 3:
                            {
                                codepoint = ((s[i] & 0xF) << 18)
                                            + ((s[i + 1] & 0x7F) << 12)
                                            + ((s[i + 2] & 0x7F) << 6)
                                            + (s[i + 3] & 0x7F);
                                break;
                            }

                            default:
                                break;  // LCOV_EXCL_LINE
                        }

                        escape_codepoint(codepoint, result, pos);
                        i += bytes;
                    }
                    else
                    {
                        // all other characters are added as-is
                        result[pos++] = s[i];
                    }
                    break;
                }
            }
        }

        assert(pos == result.size());
        o->write_characters(result.c_str(), result.size());
    }